

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

JsonNode * jsonLookupAppend(JsonParse *pParse,char *zPath,int *pApnd,char **pzErr)

{
  int iVar1;
  JsonParse *local_38;
  char **pzErr_local;
  int *pApnd_local;
  char *zPath_local;
  JsonParse *pParse_local;
  
  *pApnd = 1;
  if (*zPath == '\0') {
    jsonParseAddNode(pParse,0,0,(char *)0x0);
    if (pParse->oom == '\0') {
      local_38 = (JsonParse *)(pParse->aNode + (pParse->nNode - 1));
    }
    else {
      local_38 = (JsonParse *)0x0;
    }
    pParse_local = local_38;
  }
  else {
    if (*zPath == '.') {
      jsonParseAddNode(pParse,7,0,(char *)0x0);
    }
    else {
      iVar1 = strncmp(zPath,"[0]",3);
      if (iVar1 != 0) {
        return (JsonNode *)0x0;
      }
      jsonParseAddNode(pParse,6,0,(char *)0x0);
    }
    if (pParse->oom == '\0') {
      pParse_local = (JsonParse *)jsonLookupStep(pParse,pParse->nNode - 1,zPath,pApnd,pzErr);
    }
    else {
      pParse_local = (JsonParse *)0x0;
    }
  }
  return (JsonNode *)pParse_local;
}

Assistant:

static JsonNode *jsonLookupAppend(
  JsonParse *pParse,     /* Append content to the JSON parse */
  const char *zPath,     /* Description of content to append */
  int *pApnd,            /* Set this flag to 1 */
  const char **pzErr     /* Make this point to any syntax error */
){
  *pApnd = 1;
  if( zPath[0]==0 ){
    jsonParseAddNode(pParse, JSON_NULL, 0, 0);
    return pParse->oom ? 0 : &pParse->aNode[pParse->nNode-1];
  }
  if( zPath[0]=='.' ){
    jsonParseAddNode(pParse, JSON_OBJECT, 0, 0);
  }else if( strncmp(zPath,"[0]",3)==0 ){
    jsonParseAddNode(pParse, JSON_ARRAY, 0, 0);
  }else{
    return 0;
  }
  if( pParse->oom ) return 0;
  return jsonLookupStep(pParse, pParse->nNode-1, zPath, pApnd, pzErr);
}